

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

bool __thiscall SQLite::Statement::executeStep(Statement *this)

{
  int ret;
  int iVar1;
  Exception *this_00;
  
  ret = tryExecuteStep(this);
  if (0xfffffffd < ret - 0x66U) {
    return this->mbHasRow;
  }
  iVar1 = sqlite3_errcode(this->mpSQLite);
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  if (ret == iVar1) {
    Exception::Exception(this_00,this->mpSQLite,ret);
  }
  else {
    Exception::Exception(this_00,"Statement needs to be reseted",ret);
  }
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Statement::executeStep()
{
    const int ret = tryExecuteStep();
    if ((SQLITE_ROW != ret) && (SQLITE_DONE != ret)) // on row or no (more) row ready, else it's a problem
    {
        if (ret == sqlite3_errcode(mpSQLite))
        {
            throw SQLite::Exception(mpSQLite, ret);
        }
        else
        {
            throw SQLite::Exception("Statement needs to be reseted", ret);
        }
    }

    return mbHasRow; // true only if one row is accessible by getColumn(N)
}